

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O0

_Bool malloc_init_hard_a0_locked(void)

{
  _Bool _Var1;
  int iVar2;
  arena_t *paVar3;
  size_t sVar4;
  char *pcVar5;
  void *readlink_allocated;
  size_t buf_len;
  hpa_shard_opts_t hpa_shard_opts;
  char readlink_buf [4097];
  uint bin_shard_sizes [36];
  sc_data_t sc_data;
  _Bool result;
  malloc_mutex_lock_order_t in_stack_ffffffffffffd538;
  witness_rank_t in_stack_ffffffffffffd53c;
  undefined4 in_stack_ffffffffffffd540;
  undefined4 in_stack_ffffffffffffd544;
  base_t *in_stack_ffffffffffffd548;
  uint ind;
  tsdn_t *in_stack_ffffffffffffd550;
  base_t *in_stack_ffffffffffffd558;
  sc_data_t *in_stack_ffffffffffffd560;
  uint *in_stack_ffffffffffffd568;
  sc_data_t *in_stack_ffffffffffffd570;
  undefined8 in_stack_ffffffffffffd588;
  uint64_t uVar6;
  undefined2 uVar7;
  size_t in_stack_ffffffffffffd590;
  char local_2a68 [104];
  uint local_1a58 [36];
  undefined1 local_19c8 [6578];
  _Bool local_16;
  undefined1 uStack_15;
  undefined4 local_14;
  atomic_b_t *local_10;
  undefined4 local_8;
  undefined4 uStack_4;
  
  uVar7 = (undefined2)((ulong)in_stack_ffffffffffffd588 >> 0x30);
  malloc_initializer = pthread_self();
  memset(local_19c8,0,0x19b0);
  duckdb_je_sc_boot((sc_data_t *)0x24a9794);
  duckdb_je_bin_shard_sizes_boot(local_1a58);
  local_2a68[0] = '\0';
  malloc_conf_init(in_stack_ffffffffffffd570,in_stack_ffffffffffffd568,
                   (char *)in_stack_ffffffffffffd560);
  duckdb_je_san_init(duckdb_je_opt_lg_san_uaf_align);
  duckdb_je_sz_boot((sc_data_t *)CONCAT44(in_stack_ffffffffffffd544,in_stack_ffffffffffffd540),
                    SUB41(in_stack_ffffffffffffd53c >> 0x18,0));
  duckdb_je_bin_info_boot
            ((sc_data_t *)CONCAT44(in_stack_ffffffffffffd544,in_stack_ffffffffffffd540),
             (uint *)CONCAT44(in_stack_ffffffffffffd53c,in_stack_ffffffffffffd538));
  if ((((duckdb_je_opt_stats_print & 1U) != 0) && (iVar2 = atexit(stats_print_atexit), iVar2 != 0))
     && (duckdb_je_malloc_write("<jemalloc>: Error in atexit()\n"), (duckdb_je_opt_abort & 1U) != 0)
     ) {
    abort();
  }
  _Var1 = duckdb_je_stats_boot();
  if (_Var1) {
    local_16 = true;
  }
  else {
    _Var1 = duckdb_je_pages_boot();
    if (_Var1) {
      local_16 = true;
    }
    else {
      _Var1 = duckdb_je_base_boot((tsdn_t *)0x24a9876);
      if (_Var1) {
        local_16 = true;
      }
      else {
        duckdb_je_b0get();
        _Var1 = duckdb_je_emap_init((emap_t *)
                                    CONCAT44(in_stack_ffffffffffffd544,in_stack_ffffffffffffd540),
                                    (base_t *)
                                    CONCAT44(in_stack_ffffffffffffd53c,in_stack_ffffffffffffd538),
                                    false);
        if (_Var1) {
          local_16 = true;
        }
        else {
          _Var1 = duckdb_je_extent_boot();
          if (_Var1) {
            local_16 = true;
          }
          else {
            _Var1 = duckdb_je_ctl_boot();
            if (_Var1) {
              local_16 = true;
            }
            else {
              if (((duckdb_je_opt_hpa & 1U) != 0) && (_Var1 = duckdb_je_hpa_supported(), !_Var1)) {
                pcVar5 = "disabling";
                if ((duckdb_je_opt_abort_conf & 1U) != 0) {
                  pcVar5 = "aborting";
                }
                duckdb_je_malloc_printf
                          ("<jemalloc>: HPA not supported in the current configuration; %s.",pcVar5)
                ;
                if ((duckdb_je_opt_abort_conf & 1U) == 0) {
                  duckdb_je_opt_hpa = false;
                }
                else {
                  malloc_abort_invalid_conf();
                }
              }
              duckdb_je_b0get();
              _Var1 = duckdb_je_arena_boot
                                (in_stack_ffffffffffffd560,in_stack_ffffffffffffd558,
                                 SUB81((ulong)in_stack_ffffffffffffd550 >> 0x38,0));
              if (_Var1) {
                local_16 = true;
              }
              else {
                duckdb_je_b0get();
                _Var1 = duckdb_je_tcache_boot(in_stack_ffffffffffffd550,in_stack_ffffffffffffd548);
                if (_Var1) {
                  local_16 = true;
                }
                else {
                  _Var1 = duckdb_je_malloc_mutex_init
                                    ((malloc_mutex_t *)in_stack_ffffffffffffd548,
                                     (char *)CONCAT44(in_stack_ffffffffffffd544,
                                                      in_stack_ffffffffffffd540),
                                     in_stack_ffffffffffffd53c,in_stack_ffffffffffffd538);
                  ind = (uint)((ulong)in_stack_ffffffffffffd548 >> 0x20);
                  if (_Var1) {
                    local_16 = true;
                  }
                  else {
                    duckdb_je_hook_boot();
                    duckdb_je_narenas_auto = 1;
                    duckdb_je_manual_arena_base = 2;
                    memset(duckdb_je_arenas,0,8);
                    paVar3 = duckdb_je_arena_init
                                       (in_stack_ffffffffffffd550,ind,
                                        (arena_config_t *)
                                        CONCAT44(in_stack_ffffffffffffd544,in_stack_ffffffffffffd540
                                                ));
                    if (paVar3 == (arena_t *)0x0) {
                      local_16 = true;
                    }
                    else {
                      a0 = arena_get((tsdn_t *)in_stack_ffffffffffffd560,
                                     (uint)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                                     SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
                      if (((duckdb_je_opt_hpa & 1U) == 0) ||
                         (_Var1 = duckdb_je_hpa_supported(), _Var1)) {
                        if ((duckdb_je_opt_hpa & 1U) != 0) {
                          local_10 = &duckdb_je_background_thread_enabled_state;
                          local_14 = 0;
                          local_8 = 0;
                          uStack_4 = 0;
                          uStack_15 = duckdb_je_background_thread_enabled_state.repr;
                          uVar6 = duckdb_je_opt_hpa_opts.min_purge_interval_ms;
                          in_stack_ffffffffffffd590 = duckdb_je_opt_hpa_opts._40_8_;
                          _Var1 = duckdb_je_pa_shard_enable_hpa
                                            ((tsdn_t *)duckdb_je_opt_hpa_opts.hugification_threshold
                                             ,(pa_shard_t *)duckdb_je_opt_hpa_opts.slab_max_alloc,
                                             (hpa_shard_opts_t *)in_stack_ffffffffffffd560,
                                             (sec_opts_t *)in_stack_ffffffffffffd558);
                          uVar7 = (undefined2)(uVar6 >> 0x30);
                          if (_Var1) {
                            return true;
                          }
                        }
                      }
                      else {
                        pcVar5 = "disabling";
                        if ((duckdb_je_opt_abort_conf & 1U) != 0) {
                          pcVar5 = "aborting";
                        }
                        duckdb_je_malloc_printf
                                  ("<jemalloc>: HPA not supported in the current configuration; %s."
                                   ,pcVar5);
                        if ((duckdb_je_opt_abort_conf & 1U) == 0) {
                          duckdb_je_opt_hpa = false;
                        }
                        else {
                          malloc_abort_invalid_conf();
                        }
                      }
                      duckdb_je_malloc_init_state = malloc_init_a0_initialized;
                      sVar4 = strlen(local_2a68);
                      if ((sVar4 != 0) &&
                         (pcVar5 = (char *)a0ialloc(in_stack_ffffffffffffd590,
                                                    SUB21((ushort)uVar7 >> 8,0),SUB21(uVar7,0)),
                         pcVar5 != (char *)0x0)) {
                        memcpy(pcVar5,local_2a68,sVar4 + 1);
                        duckdb_je_opt_malloc_conf_symlink = pcVar5;
                      }
                      local_16 = false;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_16;
}

Assistant:

static bool
malloc_init_hard_a0_locked(void) {
	malloc_initializer = INITIALIZER;

	JEMALLOC_DIAGNOSTIC_PUSH
	JEMALLOC_DIAGNOSTIC_IGNORE_MISSING_STRUCT_FIELD_INITIALIZERS
	sc_data_t sc_data = {0};
	JEMALLOC_DIAGNOSTIC_POP

	/*
	 * Ordering here is somewhat tricky; we need sc_boot() first, since that
	 * determines what the size classes will be, and then
	 * malloc_conf_init(), since any slab size tweaking will need to be done
	 * before sz_boot and bin_info_boot, which assume that the values they
	 * read out of sc_data_global are final.
	 */
	sc_boot(&sc_data);
	unsigned bin_shard_sizes[SC_NBINS];
	bin_shard_sizes_boot(bin_shard_sizes);
	/*
	 * prof_boot0 only initializes opt_prof_prefix.  We need to do it before
	 * we parse malloc_conf options, in case malloc_conf parsing overwrites
	 * it.
	 */
	if (config_prof) {
		prof_boot0();
	}
	char readlink_buf[PATH_MAX + 1];
	readlink_buf[0] = '\0';
	malloc_conf_init(&sc_data, bin_shard_sizes, readlink_buf);
	san_init(opt_lg_san_uaf_align);
	sz_boot(&sc_data, opt_cache_oblivious);
	bin_info_boot(&sc_data, bin_shard_sizes);

	if (opt_stats_print) {
		/* Print statistics at exit. */
		if (atexit(stats_print_atexit) != 0) {
			malloc_write("<jemalloc>: Error in atexit()\n");
			if (opt_abort) {
				abort();
			}
		}
	}

	if (stats_boot()) {
		return true;
	}
	if (pages_boot()) {
		return true;
	}
	if (base_boot(TSDN_NULL)) {
		return true;
	}
	/* emap_global is static, hence zeroed. */
	if (emap_init(&arena_emap_global, b0get(), /* zeroed */ true)) {
		return true;
	}
	if (extent_boot()) {
		return true;
	}
	if (ctl_boot()) {
		return true;
	}
	if (config_prof) {
		prof_boot1();
	}
	if (opt_hpa && !hpa_supported()) {
		malloc_printf("<jemalloc>: HPA not supported in the current "
		    "configuration; %s.",
		    opt_abort_conf ? "aborting" : "disabling");
		if (opt_abort_conf) {
			malloc_abort_invalid_conf();
		} else {
			opt_hpa = false;
		}
	}
	if (arena_boot(&sc_data, b0get(), opt_hpa)) {
		return true;
	}
	if (tcache_boot(TSDN_NULL, b0get())) {
		return true;
	}
	if (malloc_mutex_init(&arenas_lock, "arenas", WITNESS_RANK_ARENAS,
	    malloc_mutex_rank_exclusive)) {
		return true;
	}
	hook_boot();
	/*
	 * Create enough scaffolding to allow recursive allocation in
	 * malloc_ncpus().
	 */
	narenas_auto = 1;
	manual_arena_base = narenas_auto + 1;
	memset(arenas, 0, sizeof(arena_t *) * narenas_auto);
	/*
	 * Initialize one arena here.  The rest are lazily created in
	 * arena_choose_hard().
	 */
	if (arena_init(TSDN_NULL, 0, &arena_config_default) == NULL) {
		return true;
	}
	a0 = arena_get(TSDN_NULL, 0, false);

	if (opt_hpa && !hpa_supported()) {
		malloc_printf("<jemalloc>: HPA not supported in the current "
		    "configuration; %s.",
		    opt_abort_conf ? "aborting" : "disabling");
		if (opt_abort_conf) {
			malloc_abort_invalid_conf();
		} else {
			opt_hpa = false;
		}
	} else if (opt_hpa) {
		hpa_shard_opts_t hpa_shard_opts = opt_hpa_opts;
		hpa_shard_opts.deferral_allowed = background_thread_enabled();
		if (pa_shard_enable_hpa(TSDN_NULL, &a0->pa_shard,
		    &hpa_shard_opts, &opt_hpa_sec_opts)) {
			return true;
		}
	}

	malloc_init_state = malloc_init_a0_initialized;

	size_t buf_len = strlen(readlink_buf);
	if (buf_len > 0) {
		void *readlink_allocated = a0ialloc(buf_len + 1, false, true);
		if (readlink_allocated != NULL) {
			memcpy(readlink_allocated, readlink_buf, buf_len + 1);
			opt_malloc_conf_symlink = readlink_allocated;
		}
	}

	return false;
}